

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O1

void __thiscall CppJieba::MPSegment::MPSegment(MPSegment *this,char *dictPath)

{
  allocator local_11;
  
  (this->super_SegmentBase)._isInited = false;
  (this->super_SegmentBase).super_ISegment._vptr_ISegment = (_func_int **)&PTR__MPSegment_00118c40;
  (this->_trie)._freqSum = 0;
  (this->_trie)._root = (TrieNode *)0x0;
  (this->_trie)._nodeInfoVec.
  super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_trie)._nodeInfoVec.
  super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_trie)._nodeInfoVec.
  super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_trie)._minLogFreq = 3.14e+100;
  (this->_trie)._initFlag = false;
  std::__cxx11::string::string((string *)&this->_dictPath,dictPath,&local_11);
  return;
}

Assistant:

MPSegment(const char * const dictPath): _dictPath(dictPath){}